

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InverseKinematics.cpp
# Opt level: O2

bool __thiscall
iDynTree::InverseKinematics::addCenterOfMassProjectionConstraint
          (InverseKinematics *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *supportFrames,
          vector<iDynTree::Polygon,_std::allocator<iDynTree::Polygon>_> *supportPolygons,
          Direction *xAxisOfPlaneInWorld,Direction *yAxisOfPlaneInWorld,
          Position *originOfPlaneInWorld)

{
  missingIpoptErrorReport();
  return false;
}

Assistant:

bool InverseKinematics::addCenterOfMassProjectionConstraint(const std::vector<std::string> &supportFrames,
                                                                const std::vector<Polygon> &supportPolygons,
                                                                const iDynTree::Direction xAxisOfPlaneInWorld,
                                                                const iDynTree::Direction yAxisOfPlaneInWorld,
                                                                const iDynTree::Position originOfPlaneInWorld)
    {
#ifdef IDYNTREE_USES_IPOPT
        if( supportFrames.size() == 0 )
        {
            reportError("InverseKinematics","addCenterOfMassProjectionConstraint","No support frames specified");
            return false;
        }

        if( supportFrames.size() != supportPolygons.size() )
        {
            reportError("InverseKinematics","addCenterOfMassProjectionConstraint","Size mismatch between supportFrames and supportPolygons");
            return false;
        }


        size_t nrOfSupportLinks = supportFrames.size();
        IK_PIMPL(m_pimpl)->m_comHullConstraint_supportFramesIndeces.resize(nrOfSupportLinks);

        for (int i=0; i < nrOfSupportLinks; i++)
        {
            // check for transform
            int frameIndex = IK_PIMPL(m_pimpl)->m_dynamics.getFrameIndex(supportFrames[i]);
            if (frameIndex  == iDynTree::FRAME_INVALID_INDEX)
            {
                std::stringstream ss;
                ss << "Frame " << supportFrames[i] << " not found in the model";
                reportError("InverseKinematics","addCenterOfMassProjectionConstraint",ss.str().c_str());
                return false;
            }

            IK_PIMPL(m_pimpl)->m_comHullConstraint_supportFramesIndeces[i] = frameIndex;

            internal::kinematics::TransformMap::iterator constraintIt = IK_PIMPL(m_pimpl)->m_constraints.find(frameIndex);
            if (constraintIt == IK_PIMPL(m_pimpl)->m_constraints.end())
            {
                std::stringstream ss;
                ss << "Frame " << supportFrames[i] << " is not subject to a constraint";
                reportError("InverseKinematics","addCenterOfMassProjectionConstraint",ss.str().c_str());
                return false;
            }
        }

        // Initialize the COM's projection direction in such a way that is along the lien perpendicular to the xy-axes of the World
	    iDynTree::Direction zAxisOfPlaneInWorld;
        toEigen(zAxisOfPlaneInWorld) = toEigen(xAxisOfPlaneInWorld).cross(toEigen(yAxisOfPlaneInWorld));

        IK_PIMPL(m_pimpl)->m_comHullConstraint_projDirection = zAxisOfPlaneInWorld;

        // Configuration went fine, enable constraint and save the parameters
        IK_PIMPL(m_pimpl)->m_comHullConstraint.setActive(true);
        IK_PIMPL(m_pimpl)->m_comHullConstraint_supportPolygons = supportPolygons;
        IK_PIMPL(m_pimpl)->m_comHullConstraint_xAxisOfPlaneInWorld = xAxisOfPlaneInWorld;
        IK_PIMPL(m_pimpl)->m_comHullConstraint_yAxisOfPlaneInWorld = yAxisOfPlaneInWorld;
        IK_PIMPL(m_pimpl)->m_comHullConstraint_originOfPlaneInWorld = originOfPlaneInWorld;

        // If this method is called again to reconfigure the constraint, the problem needs to be reinitialized
        IK_PIMPL(m_pimpl)->m_problemInitialized = false;

        return true;
#else
        return missingIpoptErrorReport();
#endif
    }